

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Mocap::ArchiveOUT(ChFunction_Mocap *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<int> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Mocap>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30._value = &this->samp_freq;
  local_30._name = "samp_freq";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->samples;
  local_48._name = "samples";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->timetot;
  local_60._name = "timetot";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChFunction_Mocap::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Mocap>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    ////marchive << CHNVP(array_y);
    ////marchive << CHNVP(array_y_dt);
    ////marchive << CHNVP(array_y_dtdt);
    marchive << CHNVP(samp_freq);
    marchive << CHNVP(samples);
    marchive << CHNVP(timetot);
}